

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O1

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint local_108 [8];
  uint local_e8 [20];
  uint32_t local_98 [6];
  uint32_t v [16];
  
  lVar1 = 0;
  do {
    local_98[lVar1] = *(uint32_t *)(in + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  local_108[4] = (uint)*(undefined8 *)(S->h + 4);
  local_108[0] = (uint)*(undefined8 *)S->h;
  uVar3 = local_108[0] + local_108[4] + local_98[0];
  uVar5 = S->t[0] ^ 0x510e527f ^ uVar3;
  uVar6 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_108[4] = uVar6 + 0x6a09e667 ^ local_108[4];
  uVar10 = local_108[4] << 0x14 | local_108[4] >> 0xc;
  uVar4 = uVar3 + local_98[1] + uVar10;
  uVar3 = uVar4 ^ uVar6;
  uVar5 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = uVar5 + uVar6 + 0x6a09e667;
  uVar10 = uVar10 ^ local_e8[0];
  uVar11 = uVar10 << 0x19 | uVar10 >> 7;
  uVar3 = (uint)((ulong)*(undefined8 *)(S->h + 4) >> 0x20);
  uVar10 = (int)((ulong)*(undefined8 *)S->h >> 0x20) + uVar3 + local_98[2];
  uVar6 = S->t[1] ^ 0x9b05688c ^ uVar10;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  uVar3 = uVar6 + 0xbb67ae85 ^ uVar3;
  uVar15 = uVar3 << 0x14 | uVar3 >> 0xc;
  uVar2 = uVar10 + local_98[3] + uVar15;
  uVar3 = uVar2 ^ uVar6;
  uVar10 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[1] = uVar10 + uVar6 + 0xbb67ae85;
  uVar15 = uVar15 ^ local_e8[1];
  uVar16 = uVar15 << 0x19 | uVar15 >> 7;
  local_108[6] = (uint)*(undefined8 *)(S->h + 6);
  local_108[2] = (uint)*(undefined8 *)(S->h + 2);
  uVar6 = local_108[2] + local_108[6] + local_98[4];
  uVar3 = S->f[0] ^ 0x1f83d9ab ^ uVar6;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_108[6] = uVar3 + 0x3c6ef372 ^ local_108[6];
  uVar15 = local_108[6] << 0x14 | local_108[6] >> 0xc;
  uVar7 = uVar6 + local_98[5] + uVar15;
  uVar6 = uVar7 ^ uVar3;
  uVar8 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[2] = uVar8 + uVar3 + 0x3c6ef372;
  uVar15 = uVar15 ^ local_e8[2];
  uVar9 = uVar15 << 0x19 | uVar15 >> 7;
  uVar3 = (uint)((ulong)*(undefined8 *)(S->h + 6) >> 0x20);
  uVar15 = (int)((ulong)*(undefined8 *)(S->h + 2) >> 0x20) + uVar3 + v[0];
  uVar6 = S->f[1] ^ 0x5be0cd19 ^ uVar15;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  uVar3 = uVar6 + 0xa54ff53a ^ uVar3;
  uVar13 = uVar3 << 0x14 | uVar3 >> 0xc;
  uVar15 = uVar15 + v[1] + uVar13;
  uVar3 = uVar15 ^ uVar6;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = uVar3 + uVar6 + 0xa54ff53a;
  uVar13 = uVar13 ^ local_e8[3];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar6 = uVar4 + v[2] + uVar16;
  uVar3 = uVar3 ^ uVar6;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[2] = local_e8[2] + uVar3;
  uVar16 = uVar16 ^ local_e8[2];
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar4 = uVar6 + v[3] + uVar16;
  uVar3 = uVar3 ^ uVar4;
  uVar6 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[2] = local_e8[2] + uVar6;
  uVar16 = uVar16 ^ local_e8[2];
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar2 = uVar2 + v[4] + uVar9;
  uVar5 = uVar5 ^ uVar2;
  uVar3 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar9 = uVar9 ^ local_e8[3];
  uVar5 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar2 = uVar2 + v[5] + uVar5;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = local_e8[3] + uVar3;
  uVar5 = uVar5 ^ local_e8[3];
  uVar9 = uVar5 << 0x19 | uVar5 >> 7;
  uVar7 = uVar7 + v[6] + uVar13;
  uVar10 = uVar10 ^ uVar7;
  uVar5 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_e8[0] = local_e8[0] + uVar5;
  uVar13 = uVar13 ^ local_e8[0];
  uVar10 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar7 + v[7] + uVar10;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[0] = local_e8[0] + uVar5;
  uVar10 = uVar10 ^ local_e8[0];
  uVar13 = uVar10 << 0x19 | uVar10 >> 7;
  uVar10 = uVar15 + v[8] + uVar11;
  uVar8 = uVar8 ^ uVar10;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar15 = uVar10 + v[9] + uVar11;
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar4 + v[8] + uVar11;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar11 = uVar11 ^ local_e8[0];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar4 = uVar10 + v[4] + uVar11;
  uVar3 = uVar3 ^ uVar4;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = local_e8[0] + uVar3;
  uVar11 = uVar11 ^ local_e8[0];
  uVar11 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar2 + local_98[4] + uVar16;
  uVar5 = uVar5 ^ uVar10;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[1] = local_e8[1] + uVar5;
  uVar16 = uVar16 ^ local_e8[1];
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar2 = uVar10 + v[2] + uVar16;
  uVar5 = uVar5 ^ uVar2;
  uVar10 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[1] = local_e8[1] + uVar10;
  uVar16 = uVar16 ^ local_e8[1];
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar5 = uVar7 + v[3] + uVar9;
  uVar8 = uVar8 ^ uVar5;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[2] = local_e8[2] + uVar8;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar7 = uVar5 + v[9] + uVar9;
  uVar8 = uVar8 ^ uVar7;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[2] = local_e8[2] + uVar8;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar15 = uVar15 + v[7] + uVar13;
  uVar6 = uVar6 ^ uVar15;
  uVar5 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar13 = uVar13 ^ local_e8[3];
  uVar6 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar15 = uVar15 + v[0] + uVar6;
  uVar5 = uVar5 ^ uVar15;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[3] = local_e8[3] + uVar5;
  uVar6 = uVar6 ^ local_e8[3];
  uVar13 = uVar6 << 0x19 | uVar6 >> 7;
  uVar6 = uVar4 + local_98[1] + uVar16;
  uVar5 = uVar5 ^ uVar6;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar16 = uVar16 ^ local_e8[2];
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar4 = uVar6 + v[6] + uVar16;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[2] = local_e8[2] + uVar5;
  uVar16 = uVar16 ^ local_e8[2];
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar6 = uVar2 + local_98[0] + uVar9;
  uVar3 = uVar3 ^ uVar6;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar9 = uVar9 ^ local_e8[3];
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar2 = uVar6 + local_98[2] + uVar9;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = local_e8[3] + uVar3;
  uVar9 = uVar9 ^ local_e8[3];
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar7 = uVar7 + v[5] + uVar13;
  uVar10 = uVar10 ^ uVar7;
  uVar6 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_e8[0] = local_e8[0] + uVar6;
  uVar13 = uVar13 ^ local_e8[0];
  uVar10 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar7 + v[1] + uVar10;
  uVar6 = uVar6 ^ uVar7;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[0] = local_e8[0] + uVar6;
  uVar10 = uVar10 ^ local_e8[0];
  uVar13 = uVar10 << 0x19 | uVar10 >> 7;
  uVar10 = uVar15 + local_98[5] + uVar11;
  uVar8 = uVar8 ^ uVar10;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar15 = uVar10 + local_98[3] + uVar11;
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar4 + v[5] + uVar11;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar11 = uVar11 ^ local_e8[0];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar4 = uVar10 + v[2] + uVar11;
  uVar3 = uVar3 ^ uVar4;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = local_e8[0] + uVar3;
  uVar11 = uVar11 ^ local_e8[0];
  uVar11 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar2 + v[6] + uVar16;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar16 = uVar16 ^ local_e8[1];
  uVar2 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar10 = uVar10 + local_98[0] + uVar2;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = local_e8[1] + uVar6;
  uVar2 = uVar2 ^ local_e8[1];
  uVar16 = uVar2 << 0x19 | uVar2 >> 7;
  uVar2 = uVar7 + local_98[5] + uVar9;
  uVar8 = uVar8 ^ uVar2;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[2] = local_e8[2] + uVar8;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar7 = uVar2 + local_98[2] + uVar9;
  uVar8 = uVar8 ^ uVar7;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[2] = local_e8[2] + uVar8;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar2 = uVar15 + v[9] + uVar13;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar13 = uVar13 ^ local_e8[3];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar15 = uVar2 + v[7] + uVar13;
  uVar5 = uVar5 ^ uVar15;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[3] = local_e8[3] + uVar5;
  uVar13 = uVar13 ^ local_e8[3];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar4 + v[4] + uVar16;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar16 = uVar16 ^ local_e8[2];
  uVar4 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar2 = uVar2 + v[8] + uVar4;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[2] = local_e8[2] + uVar5;
  uVar4 = uVar4 ^ local_e8[2];
  uVar16 = uVar4 << 0x19 | uVar4 >> 7;
  uVar10 = uVar10 + local_98[3] + uVar9;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar9 = uVar9 ^ local_e8[3];
  uVar4 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar10 = uVar10 + v[0] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = local_e8[3] + uVar3;
  uVar4 = uVar4 ^ local_e8[3];
  uVar9 = uVar4 << 0x19 | uVar4 >> 7;
  uVar4 = uVar7 + v[1] + uVar13;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar6;
  uVar13 = uVar13 ^ local_e8[0];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar4 + local_98[1] + uVar13;
  uVar6 = uVar6 ^ uVar7;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[0] = local_e8[0] + uVar6;
  uVar13 = uVar13 ^ local_e8[0];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar4 = uVar15 + v[3] + uVar11;
  uVar8 = uVar8 ^ uVar4;
  uVar15 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[1] = local_e8[1] + uVar15;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar4 = uVar4 + local_98[4] + uVar11;
  uVar15 = uVar15 ^ uVar4;
  uVar8 = uVar15 << 0x18 | uVar15 >> 8;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar15 = uVar11 << 0x19 | uVar11 >> 7;
  uVar2 = uVar2 + v[1] + uVar15;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar15 = uVar15 ^ local_e8[0];
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar2 = uVar2 + v[3] + uVar15;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = local_e8[0] + uVar3;
  uVar15 = uVar15 ^ local_e8[0];
  uVar11 = uVar15 << 0x19 | uVar15 >> 7;
  uVar10 = uVar10 + local_98[3] + uVar16;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar16 = uVar16 ^ local_e8[1];
  uVar15 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar10 = uVar10 + local_98[1] + uVar15;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = local_e8[1] + uVar6;
  uVar15 = uVar15 ^ local_e8[1];
  uVar16 = uVar15 << 0x19 | uVar15 >> 7;
  uVar15 = uVar7 + v[7] + uVar9;
  uVar8 = uVar8 ^ uVar15;
  uVar7 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[2] = local_e8[2] + uVar7;
  uVar9 = uVar9 ^ local_e8[2];
  uVar8 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar15 = uVar15 + v[6] + uVar8;
  uVar7 = uVar7 ^ uVar15;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[2] = local_e8[2] + uVar7;
  uVar8 = uVar8 ^ local_e8[2];
  uVar8 = uVar8 << 0x19 | uVar8 >> 7;
  uVar4 = uVar4 + v[5] + uVar13;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar13 = uVar13 ^ local_e8[3];
  uVar9 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar4 = uVar4 + v[8] + uVar9;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[3] = local_e8[3] + uVar5;
  uVar9 = uVar9 ^ local_e8[3];
  uVar13 = uVar9 << 0x19 | uVar9 >> 7;
  uVar2 = uVar2 + local_98[2] + uVar16;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar16 = uVar16 ^ local_e8[2];
  uVar9 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar2 = uVar2 + v[0] + uVar9;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[2] = local_e8[2] + uVar5;
  uVar9 = uVar9 ^ local_e8[2];
  uVar16 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar10 + local_98[5] + uVar8;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar8 = uVar8 ^ local_e8[3];
  uVar8 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar10 = uVar10 + v[4] + uVar8;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = local_e8[3] + uVar3;
  uVar8 = uVar8 ^ local_e8[3];
  uVar9 = uVar8 << 0x19 | uVar8 >> 7;
  uVar15 = uVar15 + local_98[4] + uVar13;
  uVar6 = uVar6 ^ uVar15;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar6;
  uVar13 = uVar13 ^ local_e8[0];
  uVar8 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar15 = uVar15 + local_98[0] + uVar8;
  uVar6 = uVar6 ^ uVar15;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[0] = local_e8[0] + uVar6;
  uVar8 = uVar8 ^ local_e8[0];
  uVar13 = uVar8 << 0x19 | uVar8 >> 7;
  uVar4 = uVar4 + v[9] + uVar11;
  uVar7 = uVar7 ^ uVar4;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[1] = local_e8[1] + uVar7;
  uVar11 = uVar11 ^ local_e8[1];
  uVar8 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar4 = uVar4 + v[2] + uVar8;
  uVar7 = uVar7 ^ uVar4;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[1] = local_e8[1] + uVar7;
  uVar8 = uVar8 ^ local_e8[1];
  uVar8 = uVar8 << 0x19 | uVar8 >> 7;
  uVar2 = uVar2 + v[3] + uVar8;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar8 = uVar8 ^ local_e8[0];
  uVar8 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar2 = uVar2 + local_98[0] + uVar8;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = local_e8[0] + uVar3;
  uVar8 = uVar8 ^ local_e8[0];
  uVar11 = uVar8 << 0x19 | uVar8 >> 7;
  uVar10 = uVar10 + local_98[5] + uVar16;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar16 = uVar16 ^ local_e8[1];
  uVar8 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar10 = uVar10 + v[1] + uVar8;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = local_e8[1] + uVar6;
  uVar8 = uVar8 ^ local_e8[1];
  uVar16 = uVar8 << 0x19 | uVar8 >> 7;
  uVar15 = uVar15 + local_98[2] + uVar9;
  uVar7 = uVar7 ^ uVar15;
  uVar8 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[2] = local_e8[2] + uVar8;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar7 = uVar15 + local_98[4] + uVar9;
  uVar8 = uVar8 ^ uVar7;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[2] = local_e8[2] + uVar8;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar4 = uVar4 + v[4] + uVar13;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar13 = uVar13 ^ local_e8[3];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar15 = uVar4 + v[9] + uVar13;
  uVar5 = uVar5 ^ uVar15;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[3] = local_e8[3] + uVar5;
  uVar13 = uVar13 ^ local_e8[3];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar2 + v[8] + uVar16;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar16 = uVar16 ^ local_e8[2];
  uVar4 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar2 = uVar2 + local_98[1] + uVar4;
  uVar5 = uVar5 ^ uVar2;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[2] = local_e8[2] + uVar5;
  uVar4 = uVar4 ^ local_e8[2];
  uVar16 = uVar4 << 0x19 | uVar4 >> 7;
  uVar10 = uVar10 + v[5] + uVar9;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar9 = uVar9 ^ local_e8[3];
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar10 = uVar10 + v[6] + uVar9;
  uVar3 = uVar3 ^ uVar10;
  uVar4 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = local_e8[3] + uVar4;
  uVar9 = uVar9 ^ local_e8[3];
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar7 = uVar7 + v[0] + uVar13;
  uVar6 = uVar6 ^ uVar7;
  uVar3 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar13 = uVar13 ^ local_e8[0];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar7 + v[2] + uVar13;
  uVar3 = uVar3 ^ uVar7;
  uVar6 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = local_e8[0] + uVar6;
  uVar13 = uVar13 ^ local_e8[0];
  uVar14 = uVar13 << 0x19 | uVar13 >> 7;
  uVar3 = uVar15 + local_98[3] + uVar11;
  uVar8 = uVar8 ^ uVar3;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar15 = uVar3 + v[7] + uVar11;
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[1] = local_e8[1] + uVar8;
  uVar11 = uVar11 ^ local_e8[1];
  uVar11 = uVar11 << 0x19 | uVar11 >> 7;
  uVar3 = uVar2 + local_98[2] + uVar11;
  uVar4 = uVar4 ^ uVar3;
  uVar2 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_e8[0] = local_e8[0] + uVar2;
  uVar11 = uVar11 ^ local_e8[0];
  uVar11 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar4 = uVar3 + v[6] + uVar11;
  uVar2 = uVar2 ^ uVar4;
  uVar3 = uVar2 << 0x18 | uVar2 >> 8;
  local_e8[0] = local_e8[0] + uVar3;
  uVar11 = uVar11 ^ local_e8[0];
  uVar12 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar10 + v[0] + uVar16;
  uVar6 = uVar6 ^ uVar10;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar16 = uVar16 ^ local_e8[1];
  uVar11 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar2 = uVar10 + v[4] + uVar11;
  uVar6 = uVar6 ^ uVar2;
  uVar10 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = local_e8[1] + uVar10;
  uVar11 = uVar11 ^ local_e8[1];
  uVar17 = uVar11 << 0x19 | uVar11 >> 7;
  uVar6 = uVar7 + local_98[0] + uVar9;
  uVar8 = uVar8 ^ uVar6;
  uVar7 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_e8[2] = local_e8[2] + uVar7;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar8 = uVar6 + uVar9 + v[5];
  uVar7 = uVar7 ^ uVar8;
  uVar13 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[2] = local_e8[2] + uVar13;
  uVar9 = uVar9 ^ local_e8[2];
  uVar16 = uVar9 << 0x19 | uVar9 >> 7;
  uVar6 = uVar15 + v[2] + uVar14;
  uVar5 = uVar5 ^ uVar6;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar14 = uVar14 ^ local_e8[3];
  uVar15 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar11 = uVar6 + local_98[3] + uVar15;
  uVar5 = uVar5 ^ uVar11;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[3] = local_e8[3] + uVar5;
  uVar15 = uVar15 ^ local_e8[3];
  uVar14 = uVar15 << 0x19 | uVar15 >> 7;
  uVar4 = uVar4 + uVar17 + local_98[4];
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar17 = uVar17 ^ local_e8[2];
  uVar6 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar9 = uVar4 + v[7] + uVar6;
  uVar5 = uVar5 ^ uVar9;
  uVar7 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[2] = uVar7 + local_e8[2];
  uVar6 = local_e8[2] ^ uVar6;
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar5 = uVar2 + uVar16 + v[1];
  uVar3 = uVar3 ^ uVar5;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar16 = uVar16 ^ local_e8[3];
  uVar2 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar4 = uVar5 + local_98[5] + uVar2;
  uVar3 = uVar4 ^ uVar3;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[3] = uVar3 + local_e8[3];
  uVar2 = local_e8[3] ^ uVar2;
  uVar15 = uVar2 << 0x19 | uVar2 >> 7;
  uVar2 = uVar8 + uVar14 + v[9];
  uVar10 = uVar10 ^ uVar2;
  uVar5 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_e8[0] = local_e8[0] + uVar5;
  uVar14 = uVar14 ^ local_e8[0];
  uVar10 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar14 = uVar2 + v[8] + uVar10;
  uVar5 = uVar14 ^ uVar5;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[0] = uVar5 + local_e8[0];
  uVar10 = uVar10 ^ local_e8[0];
  uVar8 = uVar10 << 0x19 | uVar10 >> 7;
  uVar10 = uVar11 + local_98[1] + uVar12;
  uVar13 = uVar13 ^ uVar10;
  uVar2 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_e8[1] = local_e8[1] + uVar2;
  uVar12 = uVar12 ^ local_e8[1];
  uVar11 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar16 = uVar10 + uVar11 + v[3];
  uVar2 = uVar16 ^ uVar2;
  uVar2 = uVar2 << 0x18 | uVar2 >> 8;
  local_e8[1] = uVar2 + local_e8[1];
  uVar11 = local_e8[1] ^ uVar11;
  uVar11 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar9 + v[6] + uVar11;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar11 = uVar11 ^ local_e8[0];
  uVar13 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar11 = uVar10 + uVar13 + local_98[5];
  uVar3 = uVar11 ^ uVar3;
  uVar9 = uVar3 << 0x18 | uVar3 >> 8;
  local_e8[0] = uVar9 + local_e8[0];
  uVar13 = local_e8[0] ^ uVar13;
  uVar12 = uVar13 << 0x19 | uVar13 >> 7;
  uVar3 = uVar6 + uVar4 + local_98[1];
  uVar5 = uVar5 ^ uVar3;
  uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[1] = local_e8[1] + uVar5;
  uVar6 = uVar6 ^ local_e8[1];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar3 = uVar3 + uVar6 + v[9];
  uVar5 = uVar3 ^ uVar5;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[1] = uVar5 + local_e8[1];
  uVar6 = local_e8[1] ^ uVar6;
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar10 = uVar15 + uVar14 + v[8];
  uVar2 = uVar2 ^ uVar10;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  local_e8[2] = local_e8[2] + uVar2;
  uVar15 = uVar15 ^ local_e8[2];
  uVar4 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar10 = uVar10 + uVar4 + v[7];
  uVar2 = uVar10 ^ uVar2;
  uVar2 = uVar2 << 0x18 | uVar2 >> 8;
  local_e8[2] = uVar2 + local_e8[2];
  uVar4 = local_e8[2] ^ uVar4;
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar15 = uVar8 + uVar16 + local_98[4];
  uVar7 = uVar7 ^ uVar15;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[3] = local_e8[3] + uVar7;
  uVar8 = uVar8 ^ local_e8[3];
  uVar8 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar15 = uVar15 + uVar8 + v[4];
  uVar7 = uVar15 ^ uVar7;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[3] = local_e8[3] + uVar7;
  uVar8 = local_e8[3] ^ uVar8;
  uVar14 = uVar8 << 0x19 | uVar8 >> 7;
  uVar8 = uVar6 + uVar11 + local_98[0];
  uVar7 = uVar7 ^ uVar8;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[2] = local_e8[2] + uVar7;
  uVar6 = uVar6 ^ local_e8[2];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar11 = uVar8 + uVar6 + v[1];
  uVar7 = uVar11 ^ uVar7;
  uVar16 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[2] = uVar16 + local_e8[2];
  uVar6 = local_e8[2] ^ uVar6;
  uVar13 = uVar6 << 0x19 | uVar6 >> 7;
  uVar3 = uVar4 + uVar3 + v[0];
  uVar9 = uVar9 ^ uVar3;
  uVar6 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_e8[3] = local_e8[3] + uVar6;
  uVar4 = uVar4 ^ local_e8[3];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar3 = uVar3 + uVar4 + local_98[3];
  uVar6 = uVar3 ^ uVar6;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[3] = uVar6 + local_e8[3];
  uVar4 = local_e8[3] ^ uVar4;
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar10 = uVar14 + uVar10 + v[3];
  uVar5 = uVar5 ^ uVar10;
  uVar7 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_e8[0] = local_e8[0] + uVar7;
  uVar14 = uVar14 ^ local_e8[0];
  uVar8 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar5 = uVar10 + uVar8 + local_98[2];
  uVar7 = uVar5 ^ uVar7;
  uVar10 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[0] = uVar10 + local_e8[0];
  uVar8 = local_e8[0] ^ uVar8;
  uVar7 = uVar8 << 0x19 | uVar8 >> 7;
  uVar15 = uVar12 + uVar15 + v[2];
  uVar2 = uVar2 ^ uVar15;
  uVar8 = uVar2 << 0x10 | uVar2 >> 0x10;
  local_e8[1] = local_e8[1] + uVar8;
  uVar12 = uVar12 ^ local_e8[1];
  uVar9 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar2 = uVar15 + uVar9 + v[5];
  uVar8 = uVar2 ^ uVar8;
  uVar15 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[1] = uVar15 + local_e8[1];
  uVar9 = local_e8[1] ^ uVar9;
  uVar8 = uVar9 << 0x19 | uVar9 >> 7;
  uVar9 = uVar11 + uVar8 + v[7];
  uVar6 = uVar6 ^ uVar9;
  uVar11 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar11;
  uVar8 = uVar8 ^ local_e8[0];
  uVar6 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar9 = uVar9 + uVar6 + v[5];
  uVar11 = uVar9 ^ uVar11;
  uVar14 = uVar11 << 0x18 | uVar11 >> 8;
  local_e8[0] = uVar14 + local_e8[0];
  uVar6 = local_e8[0] ^ uVar6;
  uVar11 = uVar6 << 0x19 | uVar6 >> 7;
  uVar3 = uVar13 + uVar3 + v[1];
  uVar10 = uVar10 ^ uVar3;
  uVar6 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar13 = uVar13 ^ local_e8[1];
  uVar10 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar3 = uVar3 + uVar10 + v[8];
  uVar6 = uVar3 ^ uVar6;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = uVar6 + local_e8[1];
  uVar10 = local_e8[1] ^ uVar10;
  uVar10 = uVar10 << 0x19 | uVar10 >> 7;
  uVar5 = uVar4 + uVar5 + v[6];
  uVar15 = uVar15 ^ uVar5;
  uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
  local_e8[2] = local_e8[2] + uVar15;
  uVar4 = uVar4 ^ local_e8[2];
  uVar8 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar5 = uVar5 + uVar8 + local_98[1];
  uVar15 = uVar5 ^ uVar15;
  uVar4 = uVar15 << 0x18 | uVar15 >> 8;
  local_e8[2] = uVar4 + local_e8[2];
  uVar8 = local_e8[2] ^ uVar8;
  uVar15 = uVar8 << 0x19 | uVar8 >> 7;
  uVar2 = uVar7 + uVar2 + local_98[3];
  uVar16 = uVar16 ^ uVar2;
  uVar8 = uVar16 << 0x10 | uVar16 >> 0x10;
  local_e8[3] = local_e8[3] + uVar8;
  uVar7 = uVar7 ^ local_e8[3];
  uVar13 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar2 = uVar2 + uVar13 + v[3];
  uVar8 = uVar2 ^ uVar8;
  uVar7 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[3] = local_e8[3] + uVar7;
  uVar13 = local_e8[3] ^ uVar13;
  uVar12 = uVar13 << 0x19 | uVar13 >> 7;
  uVar8 = uVar10 + uVar9 + local_98[5];
  uVar7 = uVar7 ^ uVar8;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[2] = local_e8[2] + uVar7;
  uVar10 = uVar10 ^ local_e8[2];
  uVar10 = uVar10 << 0x14 | uVar10 >> 0xc;
  uVar9 = uVar8 + uVar10 + local_98[0];
  uVar7 = uVar9 ^ uVar7;
  uVar16 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[2] = uVar16 + local_e8[2];
  uVar10 = local_e8[2] ^ uVar10;
  uVar13 = uVar10 << 0x19 | uVar10 >> 7;
  uVar3 = uVar15 + uVar3 + v[9];
  uVar14 = uVar14 ^ uVar3;
  uVar10 = uVar14 << 0x10 | uVar14 >> 0x10;
  local_e8[3] = local_e8[3] + uVar10;
  uVar15 = uVar15 ^ local_e8[3];
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar3 = uVar3 + uVar15 + local_98[4];
  uVar10 = uVar3 ^ uVar10;
  uVar10 = uVar10 << 0x18 | uVar10 >> 8;
  local_e8[3] = uVar10 + local_e8[3];
  uVar15 = local_e8[3] ^ uVar15;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar5 = uVar12 + uVar5 + v[2];
  uVar6 = uVar6 ^ uVar5;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar6;
  uVar12 = uVar12 ^ local_e8[0];
  uVar7 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar5 = uVar5 + uVar7 + v[0];
  uVar6 = uVar5 ^ uVar6;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[0] = uVar6 + local_e8[0];
  uVar7 = local_e8[0] ^ uVar7;
  uVar7 = uVar7 << 0x19 | uVar7 >> 7;
  uVar2 = uVar11 + uVar2 + local_98[2];
  uVar4 = uVar4 ^ uVar2;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_e8[1] = local_e8[1] + uVar4;
  uVar11 = uVar11 ^ local_e8[1];
  uVar8 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar2 = uVar2 + uVar8 + v[4];
  uVar4 = uVar2 ^ uVar4;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_e8[1] = uVar4 + local_e8[1];
  uVar8 = local_e8[1] ^ uVar8;
  uVar8 = uVar8 << 0x19 | uVar8 >> 7;
  uVar9 = uVar9 + uVar8 + v[0];
  uVar10 = uVar10 ^ uVar9;
  uVar11 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_e8[0] = local_e8[0] + uVar11;
  uVar8 = uVar8 ^ local_e8[0];
  uVar10 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar9 = uVar9 + uVar10 + v[9];
  uVar11 = uVar9 ^ uVar11;
  uVar14 = uVar11 << 0x18 | uVar11 >> 8;
  local_e8[0] = uVar14 + local_e8[0];
  uVar10 = local_e8[0] ^ uVar10;
  uVar11 = uVar10 << 0x19 | uVar10 >> 7;
  uVar3 = uVar13 + uVar3 + v[8];
  uVar6 = uVar6 ^ uVar3;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar13 = uVar13 ^ local_e8[1];
  uVar10 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar3 = uVar3 + uVar10 + v[3];
  uVar6 = uVar3 ^ uVar6;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = uVar6 + local_e8[1];
  uVar10 = local_e8[1] ^ uVar10;
  uVar10 = uVar10 << 0x19 | uVar10 >> 7;
  uVar5 = uVar15 + uVar5 + v[5];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_e8[2] = local_e8[2] + uVar4;
  uVar15 = uVar15 ^ local_e8[2];
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar5 = uVar5 + uVar15 + local_98[3];
  uVar4 = uVar5 ^ uVar4;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_e8[2] = uVar4 + local_e8[2];
  uVar15 = local_e8[2] ^ uVar15;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar2 = uVar7 + uVar2 + local_98[0];
  uVar16 = uVar16 ^ uVar2;
  uVar8 = uVar16 << 0x10 | uVar16 >> 0x10;
  local_e8[3] = local_e8[3] + uVar8;
  uVar7 = uVar7 ^ local_e8[3];
  uVar13 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar2 = uVar2 + uVar13 + v[2];
  uVar8 = uVar2 ^ uVar8;
  uVar7 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[3] = local_e8[3] + uVar7;
  uVar13 = local_e8[3] ^ uVar13;
  uVar12 = uVar13 << 0x19 | uVar13 >> 7;
  uVar8 = uVar10 + uVar9 + v[6];
  uVar7 = uVar7 ^ uVar8;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[2] = local_e8[2] + uVar7;
  uVar10 = uVar10 ^ local_e8[2];
  uVar10 = uVar10 << 0x14 | uVar10 >> 0xc;
  uVar9 = uVar8 + uVar10 + local_98[2];
  uVar7 = uVar9 ^ uVar7;
  uVar16 = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[2] = uVar16 + local_e8[2];
  uVar10 = local_e8[2] ^ uVar10;
  uVar13 = uVar10 << 0x19 | uVar10 >> 7;
  uVar3 = uVar15 + uVar3 + v[7];
  uVar14 = uVar14 ^ uVar3;
  uVar10 = uVar14 << 0x10 | uVar14 >> 0x10;
  local_e8[3] = local_e8[3] + uVar10;
  uVar15 = uVar15 ^ local_e8[3];
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar3 = uVar3 + uVar15 + v[1];
  uVar10 = uVar3 ^ uVar10;
  uVar10 = uVar10 << 0x18 | uVar10 >> 8;
  local_e8[3] = uVar10 + local_e8[3];
  uVar15 = local_e8[3] ^ uVar15;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar5 = uVar12 + uVar5 + local_98[1];
  uVar6 = uVar6 ^ uVar5;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar6;
  uVar12 = uVar12 ^ local_e8[0];
  uVar7 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar5 = uVar5 + uVar7 + local_98[4];
  uVar6 = uVar5 ^ uVar6;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[0] = uVar6 + local_e8[0];
  uVar7 = local_e8[0] ^ uVar7;
  uVar7 = uVar7 << 0x19 | uVar7 >> 7;
  uVar2 = uVar11 + uVar2 + v[4];
  uVar4 = uVar4 ^ uVar2;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_e8[1] = local_e8[1] + uVar4;
  uVar11 = uVar11 ^ local_e8[1];
  uVar8 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar2 = uVar2 + uVar8 + local_98[5];
  uVar4 = uVar2 ^ uVar4;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_e8[1] = uVar4 + local_e8[1];
  uVar8 = local_e8[1] ^ uVar8;
  uVar8 = uVar8 << 0x19 | uVar8 >> 7;
  uVar9 = uVar9 + uVar8 + v[4];
  uVar10 = uVar10 ^ uVar9;
  uVar11 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_e8[0] = local_e8[0] + uVar11;
  uVar8 = uVar8 ^ local_e8[0];
  uVar10 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar9 = uVar9 + uVar10 + local_98[2];
  uVar11 = uVar9 ^ uVar11;
  uVar14 = uVar11 << 0x18 | uVar11 >> 8;
  local_e8[0] = uVar14 + local_e8[0];
  uVar10 = local_e8[0] ^ uVar10;
  uVar11 = uVar10 << 0x19 | uVar10 >> 7;
  uVar3 = uVar13 + uVar3 + v[2];
  uVar6 = uVar6 ^ uVar3;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[1] = local_e8[1] + uVar6;
  uVar13 = uVar13 ^ local_e8[1];
  uVar10 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar3 = uVar3 + uVar10 + local_98[4];
  uVar6 = uVar3 ^ uVar6;
  uVar6 = uVar6 << 0x18 | uVar6 >> 8;
  local_e8[1] = uVar6 + local_e8[1];
  uVar10 = local_e8[1] ^ uVar10;
  uVar10 = uVar10 << 0x19 | uVar10 >> 7;
  uVar5 = uVar15 + uVar5 + v[1];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_e8[2] = local_e8[2] + uVar4;
  uVar15 = uVar15 ^ local_e8[2];
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar5 = uVar5 + uVar15 + v[0];
  uVar4 = uVar5 ^ uVar4;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_e8[2] = uVar4 + local_e8[2];
  uVar15 = local_e8[2] ^ uVar15;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar2 = uVar7 + uVar2 + local_98[1];
  uVar16 = uVar16 ^ uVar2;
  uVar8 = uVar16 << 0x10 | uVar16 >> 0x10;
  local_e8[3] = local_e8[3] + uVar8;
  uVar7 = uVar7 ^ local_e8[3];
  uVar13 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar2 = uVar2 + uVar13 + local_98[5];
  uVar8 = uVar2 ^ uVar8;
  uVar7 = uVar8 << 0x18 | uVar8 >> 8;
  local_e8[3] = local_e8[3] + uVar7;
  uVar13 = local_e8[3] ^ uVar13;
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar8 = uVar10 + uVar9 + v[9];
  uVar7 = uVar7 ^ uVar8;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_e8[2] = local_e8[2] + uVar7;
  uVar10 = uVar10 ^ local_e8[2];
  uVar10 = uVar10 << 0x14 | uVar10 >> 0xc;
  local_108[0] = uVar8 + uVar10 + v[5];
  uVar7 = local_108[0] ^ uVar7;
  local_e8[7] = uVar7 << 0x18 | uVar7 >> 8;
  local_e8[2] = local_e8[7] + local_e8[2];
  uVar10 = local_e8[2] ^ uVar10;
  uVar3 = uVar15 + uVar3 + v[3];
  uVar14 = uVar14 ^ uVar3;
  uVar7 = uVar14 << 0x10 | uVar14 >> 0x10;
  local_e8[3] = local_e8[3] + uVar7;
  uVar15 = uVar15 ^ local_e8[3];
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  local_108[1] = uVar3 + uVar15 + v[8];
  local_108[1] = local_108[1] ^ uVar7;
  local_e8[4] = local_108[1] << 0x18 | local_108[1] >> 8;
  local_e8[3] = local_e8[4] + local_e8[3];
  local_e8[3] = local_e8[3] ^ uVar15;
  uVar3 = uVar13 + uVar5 + local_98[3];
  uVar6 = uVar6 ^ uVar3;
  uVar5 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_e8[0] = local_e8[0] + uVar5;
  uVar13 = uVar13 ^ local_e8[0];
  uVar6 = uVar13 << 0x14 | uVar13 >> 0xc;
  local_108[2] = uVar3 + uVar6 + v[6];
  uVar5 = local_108[2] ^ uVar5;
  local_e8[5] = uVar5 << 0x18 | uVar5 >> 8;
  local_e8[0] = local_e8[5] + local_e8[0];
  uVar6 = local_e8[0] ^ uVar6;
  local_108[7] = uVar6 << 0x19 | uVar6 >> 7;
  local_108[6] = local_e8[3] << 0x19 | local_e8[3] >> 7;
  uVar3 = uVar11 + uVar2 + v[7];
  uVar4 = uVar4 ^ uVar3;
  uVar5 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_e8[1] = local_e8[1] + uVar5;
  uVar11 = uVar11 ^ local_e8[1];
  uVar6 = uVar11 << 0x14 | uVar11 >> 0xc;
  local_108[3] = uVar3 + uVar6 + local_98[0];
  local_108[3] = local_108[3] ^ uVar5;
  local_e8[6] = local_108[3] << 0x18 | local_108[3] >> 8;
  local_e8[1] = local_e8[6] + local_e8[1];
  local_e8[1] = local_e8[1] ^ uVar6;
  local_108[5] = uVar10 << 0x19 | uVar10 >> 7;
  local_108[4] = local_e8[1] << 0x19 | local_e8[1] >> 7;
  lVar1 = 0;
  do {
    S->h[lVar1] = local_108[lVar1] ^ S->h[lVar1] ^ local_e8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}